

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  wasm_frame_t *frame;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  wasm_valtype_t *rs [1];
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_valtype_vec_t results;
  wasm_extern_t *imports [1];
  ulong local_88;
  long local_80;
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  long local_60;
  undefined1 local_58 [8];
  void *local_50;
  undefined1 local_48 [8];
  undefined8 local_40;
  undefined8 local_38;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("trap.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_58,sVar3);
    sVar3 = fread(local_50,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,local_58);
      if (lVar4 == 0) {
        pcVar8 = "> Error compiling module!";
      }
      else {
        local_70 = uVar1;
        wasm_byte_vec_delete(local_58);
        puts("Creating callback...");
        local_88 = wasm_valtype_new(0);
        wasm_valtype_vec_new_empty(&local_68);
        wasm_valtype_vec_new(local_48,1,&local_88);
        uVar1 = wasm_functype_new(&local_68,local_48);
        uVar5 = wasm_func_new_with_env(uVar2,uVar1,fail_callback,uVar2,0);
        wasm_functype_delete(uVar1);
        puts("Instantiating module...");
        local_38 = wasm_func_as_extern(uVar5);
        lVar6 = wasm_instance_new(uVar2,lVar4,&local_38,0);
        if (lVar6 != 0) {
          wasm_func_delete(uVar5);
          puts("Extracting exports...");
          wasm_instance_exports(lVar6,&local_68);
          if (local_68 < 2) {
            iVar7 = 1;
            pcVar8 = "> Error accessing exports!";
          }
          else {
            local_78 = uVar2;
            wasm_module_delete(lVar4);
            wasm_instance_delete(lVar6);
            bVar11 = false;
            iVar7 = 0;
            uVar9 = 0;
            do {
              lVar4 = wasm_extern_as_func(*(undefined8 *)(local_60 + uVar9 * 8));
              if (lVar4 == 0) {
                pcVar8 = "> Error accessing export!";
LAB_00102722:
                puts(pcVar8);
                iVar7 = 1;
                bVar12 = false;
              }
              else {
                printf("Calling export %d...\n",uVar9 & 0xffffffff);
                lVar4 = wasm_func_call(lVar4,0,0);
                if (lVar4 == 0) {
                  pcVar8 = "> Error calling function, expected trap!";
                  goto LAB_00102722;
                }
                puts("Printing message...");
                wasm_trap_message(lVar4,local_48);
                printf("> %s\n",local_40);
                puts("Printing origin...");
                frame = (wasm_frame_t *)wasm_trap_origin(lVar4);
                if (frame == (wasm_frame_t *)0x0) {
                  puts("> Empty origin.");
                }
                else {
                  print_frame(frame);
                  wasm_frame_delete(frame);
                }
                puts("Printing trace...");
                wasm_trap_trace(lVar4,&local_88);
                if (local_88 == 0) {
                  puts("> Empty trace.");
                }
                else if (local_88 != 0) {
                  uVar10 = 0;
                  do {
                    print_frame(*(wasm_frame_t **)(local_80 + uVar10 * 8));
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < local_88);
                }
                wasm_frame_vec_delete(&local_88);
                wasm_trap_delete(lVar4);
                wasm_byte_vec_delete(local_48);
                bVar12 = true;
              }
              if (!bVar12) break;
              bVar12 = uVar9 == 0;
              bVar11 = !bVar12;
              uVar9 = uVar9 + 1;
            } while (bVar12);
            if (!bVar11) {
              return iVar7;
            }
            wasm_extern_vec_delete(&local_68);
            puts("Shutting down...");
            wasm_store_delete(local_78);
            wasm_engine_delete(local_70);
            iVar7 = 0;
            pcVar8 = "Done.";
          }
          puts(pcVar8);
          return iVar7;
        }
        pcVar8 = "> Error instantiating module!";
      }
      goto LAB_00102629;
    }
  }
  pcVar8 = "> Error loading module!";
LAB_00102629:
  puts(pcVar8);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("trap.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* fail_type =
    wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* fail_func =
    wasm_func_new_with_env(store, fail_type, fail_callback, store, NULL);

  wasm_functype_delete(fail_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(fail_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(fail_func);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size < 2) {
    printf("> Error accessing exports!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  for (int i = 0; i < 2; ++i) {
    const wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
    if (func == NULL) {
      printf("> Error accessing export!\n");
      return 1;
    }

    printf("Calling export %d...\n", i);
    own wasm_trap_t* trap = wasm_func_call(func, NULL, NULL);
    if (!trap) {
      printf("> Error calling function, expected trap!\n");
      return 1;
    }

    printf("Printing message...\n");
    own wasm_name_t message;
    wasm_trap_message(trap, &message);
    printf("> %s\n", message.data);

    printf("Printing origin...\n");
    own wasm_frame_t* frame = wasm_trap_origin(trap);
    if (frame) {
      print_frame(frame);
      wasm_frame_delete(frame);
    } else {
      printf("> Empty origin.\n");
    }

    printf("Printing trace...\n");
    own wasm_frame_vec_t trace;
    wasm_trap_trace(trap, &trace);
    if (trace.size > 0) {
      for (size_t i = 0; i < trace.size; ++i) {
        print_frame(trace.data[i]);
      }
    } else {
      printf("> Empty trace.\n");
    }

    wasm_frame_vec_delete(&trace);
    wasm_trap_delete(trap);
    wasm_name_delete(&message);
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}